

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O1

int json_decode(lua_State *l)

{
  int iVar1;
  size_t json_len;
  json_parse_t json;
  json_token_t token;
  int local_60;
  undefined4 uStack_5c;
  json_parse_t local_58;
  json_token_t local_30;
  
  iVar1 = lua_gettop(l);
  if (iVar1 != 1) {
    luaL_argerror(l,1,"expected 1 argument");
  }
  local_58.cfg = json_fetch_config(l);
  local_58.data = luaL_checklstring(l,1,(size_t *)&local_60);
  local_58.current_depth = 0;
  local_58.ptr = local_58.data;
  if ((1 < CONCAT44(uStack_5c,local_60)) && ((*local_58.data == '\0' || (local_58.data[1] == '\0')))
     ) {
    luaL_error(l,"JSON parser does not support UTF-16 or UTF-32");
  }
  local_58.tmp = strbuf_new(local_60);
  json_next_token(&local_58,&local_30);
  json_process_value(l,&local_58,&local_30);
  json_next_token(&local_58,&local_30);
  if (local_30.type != T_END) {
    json_throw_parse_error(l,&local_58,"the end",&local_30);
  }
  strbuf_free(local_58.tmp);
  return 1;
}

Assistant:

static int json_decode(lua_State *l)
{
    json_parse_t json;
    json_token_t token;
    size_t json_len;

    luaL_argcheck(l, lua_gettop(l) == 1, 1, "expected 1 argument");

    json.cfg = json_fetch_config(l);
    json.data = luaL_checklstring(l, 1, &json_len);
    json.current_depth = 0;
    json.ptr = json.data;

    /* Detect Unicode other than UTF-8 (see RFC 4627, Sec 3)
     *
     * CJSON can support any simple data type, hence only the first
     * character is guaranteed to be ASCII (at worst: '"'). This is
     * still enough to detect whether the wrong encoding is in use. */
    if (json_len >= 2 && (!json.data[0] || !json.data[1]))
        luaL_error(l, "JSON parser does not support UTF-16 or UTF-32");

    /* Ensure the temporary buffer can hold the entire string.
     * This means we no longer need to do length checks since the decoded
     * string must be smaller than the entire json string */
    json.tmp = strbuf_new(json_len);

    json_next_token(&json, &token);
    json_process_value(l, &json, &token);

    /* Ensure there is no more input left */
    json_next_token(&json, &token);

    if (token.type != T_END)
        json_throw_parse_error(l, &json, "the end", &token);

    strbuf_free(json.tmp);

    return 1;
}